

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_watch_file_current_dir(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_timer_t timer;
  
  loop = uv_default_loop();
  remove("watch_file");
  create_file("watch_file");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  timer.data = (void *)(long)iVar1;
  if (timer.data == (void *)0x0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file_current_dir,"watch_file",0);
    timer.data = (void *)(long)iVar1;
    if (timer.data == (void *)0x0) {
      iVar1 = uv_timer_init(loop,&timer);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        timer.data = "watch_file";
        iVar1 = uv_timer_start(&timer,timer_cb_touch,0x44c,0);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b == (void *)0x0) {
          eval_b = (int64_t)timer_cb_touch_called;
          eval_b_2 = 0;
          if ((void *)eval_b == (void *)0x0) {
            eval_b = (int64_t)fs_event_cb_called;
            eval_b_2 = 0;
            if ((void *)eval_b == (void *)0x0) {
              eval_b = (int64_t)close_cb_called;
              eval_b_2 = 0;
              if ((void *)eval_b == (void *)0x0) {
                uv_run(loop,UV_RUN_DEFAULT);
                eval_b = 1;
                eval_b_2 = (int64_t)timer_cb_touch_called;
                if (eval_b_2 == 1) {
                  eval_b = 0;
                  if (fs_event_cb_called == 0) {
                    pcVar4 = "!=";
                    pcVar5 = "fs_event_cb_called";
                    pcVar3 = "0";
                    uVar2 = 0x2d7;
                    eval_b_2 = 0;
                  }
                  else {
                    eval_b = 1;
                    eval_b_2 = (int64_t)close_cb_called;
                    if (eval_b_2 == 1) {
                      remove("watch_file");
                      close_loop(loop);
                      eval_b = 0;
                      iVar1 = uv_loop_close(loop);
                      eval_b_2 = (int64_t)iVar1;
                      if (eval_b_2 == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar4 = "==";
                      pcVar5 = "uv_loop_close(loop)";
                      pcVar3 = "0";
                      uVar2 = 0x2dd;
                    }
                    else {
                      pcVar4 = "==";
                      pcVar5 = "close_cb_called";
                      pcVar3 = "1";
                      uVar2 = 0x2d8;
                    }
                  }
                }
                else {
                  pcVar4 = "==";
                  pcVar5 = "timer_cb_touch_called";
                  pcVar3 = "1";
                  uVar2 = 0x2d5;
                }
              }
              else {
                pcVar4 = "==";
                pcVar5 = "0";
                pcVar3 = "close_cb_called";
                uVar2 = 0x2d1;
              }
            }
            else {
              pcVar4 = "==";
              pcVar5 = "0";
              pcVar3 = "fs_event_cb_called";
              uVar2 = 0x2d0;
            }
          }
          else {
            pcVar4 = "==";
            pcVar5 = "0";
            pcVar3 = "timer_cb_touch_called";
            uVar2 = 0x2cf;
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "0";
          pcVar3 = "r";
          uVar2 = 0x2cd;
        }
      }
      else {
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "r";
        uVar2 = 0x2c9;
      }
      goto LAB_0011d0d2;
    }
    uVar2 = 0x2c5;
  }
  else {
    uVar2 = 0x2c0;
  }
  pcVar5 = "0";
  pcVar3 = "r";
  eval_b_2 = 0;
  pcVar4 = "==";
  eval_b = (int64_t)timer.data;
LAB_0011d0d2:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_b,pcVar4,eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file_current_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_timer_t timer;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_file");
  create_file("watch_file");
#if defined(__APPLE__) && !defined(MAC_OS_X_VERSION_10_12)
  /* Empirically, kevent seems to (sometimes) report the preceding
   * create_file events prior to macOS 10.11.6 in the subsequent fs_event_start
   * So let the system settle before running the test. */
  uv_sleep(1100);
  uv_update_time(loop);
#endif

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        "watch_file",
                        0);
  ASSERT_OK(r);


  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  timer.data = "watch_file";
  r = uv_timer_start(&timer, timer_cb_touch, 1100, 0);
  ASSERT_OK(r);

  ASSERT_OK(timer_cb_touch_called);
  ASSERT_OK(fs_event_cb_called);
  ASSERT_OK(close_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, timer_cb_touch_called);
  /* FSEvents on macOS sometimes sends one change event, sometimes two. */
  ASSERT_NE(0, fs_event_cb_called);
  ASSERT_EQ(1, close_cb_called);

  /* Cleanup */
  remove("watch_file");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}